

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t cdeque_init(cdeque *d,wchar_t max_capacity_power_of_2)

{
  size_t *psVar1;
  wchar_t max_capacity_power_of_2_local;
  cdeque *d_local;
  
  if ((d == (cdeque *)0x0) || (max_capacity_power_of_2 == L'\0')) {
    d_local._4_4_ = L'\x02';
  }
  else {
    d->cap_mask = (short)max_capacity_power_of_2 - 1;
    d->arr = (size_t *)0x0;
    if ((max_capacity_power_of_2 & (uint)d->cap_mask) == 0) {
      cdeque_clear(d);
      psVar1 = (size_t *)malloc((long)max_capacity_power_of_2 << 3);
      d->arr = psVar1;
      d_local._4_4_ = (wchar_t)(d->arr == (size_t *)0x0);
    }
    else {
      d_local._4_4_ = L'\x02';
    }
  }
  return d_local._4_4_;
}

Assistant:

static int cdeque_init(struct cdeque* d, int max_capacity_power_of_2) {
	if(d == NULL || max_capacity_power_of_2 == 0)
		return CDE_PARAM;

	d->cap_mask = max_capacity_power_of_2 - 1;
	d->arr = NULL;

	if((max_capacity_power_of_2 & d->cap_mask) != 0)
		return CDE_PARAM;

	cdeque_clear(d);
	d->arr = malloc(sizeof(void*) * max_capacity_power_of_2);

	return d->arr ? CDE_OK : CDE_ALLOC;
}